

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

void __thiscall cmTarget::MaybeInvalidatePropertyCache(cmTarget *this,string *prop)

{
  pointer pcVar1;
  long *plVar2;
  int iVar3;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  if (this->IsImportedTarget == true) {
    pcVar1 = (prop->_M_dataplus)._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar1,pcVar1 + prop->_M_string_length);
    plVar2 = local_48[0];
    iVar3 = strncmp((char *)local_48[0],"IMPORTED",8);
    if (plVar2 != local_38) {
      operator_delete(plVar2,local_38[0] + 1);
    }
    if (iVar3 == 0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>_>_>
      ::clear(&(((this->Internal).Pointer)->ImportInfoMap)._M_t);
    }
  }
  if (this->IsImportedTarget == false) {
    pcVar1 = (prop->_M_dataplus)._M_p;
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,pcVar1,pcVar1 + prop->_M_string_length);
    plVar2 = local_68[0];
    iVar3 = strncmp((char *)local_68[0],"LINK_INTERFACE_",0xf);
    if (plVar2 != local_58) {
      operator_delete(plVar2,local_58[0] + 1);
    }
    if (iVar3 == 0) {
      ClearLinkMaps(this);
    }
  }
  return;
}

Assistant:

void cmTarget::MaybeInvalidatePropertyCache(const std::string& prop)
{
  // Wipe out maps caching information affected by this property.
  if(this->IsImported() && cmHasLiteralPrefix(prop, "IMPORTED"))
    {
    this->Internal->ImportInfoMap.clear();
    }
  if(!this->IsImported() && cmHasLiteralPrefix(prop, "LINK_INTERFACE_"))
    {
    this->ClearLinkMaps();
    }
}